

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidriver.c
# Opt level: O1

FT_Error cid_get_ros(CID_Face face,char **registry,char **ordering,FT_Int *supplement)

{
  if (registry != (char **)0x0) {
    *registry = (face->cid).registry;
  }
  if (ordering != (char **)0x0) {
    *ordering = (face->cid).ordering;
  }
  if (supplement != (FT_Int *)0x0) {
    *supplement = (face->cid).supplement;
  }
  return 0;
}

Assistant:

static FT_Error
  cid_get_ros( CID_Face      face,
               const char*  *registry,
               const char*  *ordering,
               FT_Int       *supplement )
  {
    CID_FaceInfo  cid = &face->cid;


    if ( registry )
      *registry = cid->registry;

    if ( ordering )
      *ordering = cid->ordering;

    if ( supplement )
      *supplement = cid->supplement;

    return FT_Err_Ok;
  }